

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextDiagnosticClient.cpp
# Opt level: O0

void __thiscall slang::TextDiagnosticClient::TextDiagnosticClient(TextDiagnosticClient *this)

{
  DiagnosticClient *in_RDI;
  
  DiagnosticClient::DiagnosticClient(in_RDI);
  in_RDI->_vptr_DiagnosticClient = (_func_int **)&PTR__TextDiagnosticClient_00e42318;
  std::make_unique<slang::FormatBuffer>();
  *(undefined1 *)&in_RDI[1].engine = 1;
  *(undefined1 *)((long)&in_RDI[1].engine + 1) = 1;
  *(undefined1 *)((long)&in_RDI[1].engine + 2) = 1;
  *(undefined1 *)((long)&in_RDI[1].engine + 3) = 1;
  *(undefined1 *)((long)&in_RDI[1].engine + 4) = 1;
  *(undefined1 *)((long)&in_RDI[1].engine + 5) = 1;
  *(undefined4 *)&in_RDI[1].sourceManager = 0;
  in_RDI->field_0x19 = 0x5a;
  in_RDI->field_0x1a = 0x5d;
  in_RDI->field_0x1b = 0x5b;
  in_RDI->field_0x1c = 0x5b;
  in_RDI->field_0x1d = 0x5c;
  in_RDI->field_0x1e = 0x24;
  in_RDI->field_0x1f = 0x60;
  return;
}

Assistant:

TextDiagnosticClient::TextDiagnosticClient() : buffer(std::make_unique<FormatBuffer>()) {
    noteColor = fmt::terminal_color::bright_black;
    warningColor = fmt::terminal_color::bright_yellow;
    errorColor = fmt::terminal_color::bright_red;
    fatalColor = fmt::terminal_color::bright_red;
    highlightColor = fmt::terminal_color::bright_green;
    filenameColor = fmt::terminal_color::cyan;
    locationColor = fmt::terminal_color::bright_cyan;
}